

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O0

void __thiscall front::symbol::ArraySymbol::~ArraySymbol(ArraySymbol *this)

{
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *unaff_retaddr;
  
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::~vector(unaff_retaddr);
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::~vector(unaff_retaddr);
  std::shared_ptr<front::symbol::Symbol>::~shared_ptr((shared_ptr<front::symbol::Symbol> *)0x2b2de8)
  ;
  Symbol::~Symbol((Symbol *)0x2b2df2);
  return;
}

Assistant:

virtual ~ArraySymbol() {}